

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O1

string * duckdb::StackTrace::ResolveStacktraceSymbols
                   (string *__return_storage_ptr__,string *pointers)

{
  _Head_base<0UL,_void_**,_false> _Var1;
  ulong uVar2;
  int iVar3;
  reference str;
  void *pvVar4;
  type ppvVar5;
  size_type __n;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> callstack;
  int status;
  string mangled_symbol;
  string result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  pointer *local_140;
  ulong local_138;
  undefined1 local_130 [32];
  _Head_base<0UL,_void_**,_false> local_110;
  pointer *local_108;
  ulong local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  size_type sStack_f0;
  int local_e4;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  string local_c0;
  ulong local_a0;
  string *local_98;
  void *local_90;
  pointer *local_88;
  ulong local_80;
  pointer local_78;
  size_type sStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_98 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,";","");
  StringUtil::Split(&local_48,pointers,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  local_a0 = (long)local_48.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_110._M_head_impl =
       (void **)operator_new__(-(ulong)(local_a0 >> 0x3d != 0) |
                               (long)local_48.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_48.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
  local_130._24_8_ =
       local_48.
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar8 = local_a0 + (local_a0 == 0);
    __n = 0;
    do {
      str = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[](&local_48,__n);
      pvVar4 = (void *)StringUtil::ToUnsigned((string *)str);
      ppvVar5 = unique_ptr<void_*[],_std::default_delete<void_*[]>,_true>::operator[]
                          ((unique_ptr<void_*[],_std::default_delete<void_*[]>,_true> *)&local_110,
                           __n);
      *ppvVar5 = pvVar4;
      __n = __n + 1;
    } while (sVar8 != __n);
  }
  uVar2 = local_a0;
  _Var1._M_head_impl = local_110._M_head_impl;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  iVar3 = NumericCastImpl<int,_unsigned_long,_false>::Convert(local_a0);
  local_90 = (void *)backtrace_symbols(_Var1._M_head_impl,iVar3);
  if (local_48.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_130._24_8_) {
    local_130._24_8_ = local_130;
    lVar9 = 0;
    do {
      ::std::__cxx11::string::string
                ((string *)&local_108,*(char **)((long)local_90 + lVar9 * 8),
                 (allocator *)(local_130 + 0x17));
      uVar7 = local_100;
      if (local_100 != 0) {
        uVar6 = 0;
        do {
          uVar7 = uVar6;
          if (*(char *)((long)local_108 + uVar6) == '_') break;
          uVar6 = uVar6 + 1;
          uVar7 = local_100;
        } while (local_100 != uVar6);
      }
      uVar6 = uVar7;
      if (uVar7 < local_100) {
        do {
          if (((ulong)*(byte *)((long)local_108 + uVar6) < 0x2c) &&
             ((0xa0100003e00U >> ((ulong)*(byte *)((long)local_108 + uVar6) & 0x3f) & 1) != 0))
          goto LAB_01414cea;
          uVar6 = uVar6 + 1;
        } while (local_100 != uVar6);
      }
      uVar6 = 0;
LAB_01414cea:
      if (uVar7 < uVar6) {
        ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)&local_108);
        pvVar4 = (void *)__cxa_demangle(local_c0._M_dataplus._M_p,0,0,&local_e4);
        if (local_e4 == 0 && pvVar4 != (void *)0x0) {
          local_140 = (pointer *)local_130;
          local_138 = 0;
          local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
          ::std::__cxx11::string::substr((ulong)local_e0,(ulong)&local_108);
          ::std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0[0]);
          if (local_e0[0] != local_d0) {
            operator_delete(local_e0[0]);
          }
          ::std::__cxx11::string::append((char *)&local_140);
          ::std::__cxx11::string::substr((ulong)local_e0,(ulong)&local_108);
          ::std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_e0[0]);
          if (local_e0[0] != local_d0) {
            operator_delete(local_e0[0]);
          }
          free(pvVar4);
        }
        else {
          local_140 = (pointer *)local_130;
          if (local_108 == (pointer *)&local_f8) {
            local_130._8_8_ = sStack_f0;
          }
          else {
            local_140 = local_108;
          }
          local_130._1_7_ = uStack_f7;
          local_130[0] = local_f8;
          local_138 = local_100;
          local_100 = 0;
          local_f8 = 0;
          local_108 = (pointer *)&local_f8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      else {
        local_140 = (pointer *)local_130;
        if (local_108 == (pointer *)&local_f8) {
          local_130._8_8_ = sStack_f0;
        }
        else {
          local_140 = local_108;
        }
        local_130._1_7_ = uStack_f7;
        local_130[0] = local_f8;
        local_138 = local_100;
        local_100 = 0;
        local_f8 = 0;
        local_108 = (pointer *)&local_f8;
      }
      local_88 = &local_78;
      if (local_140 == (pointer *)local_130) {
        sStack_70 = local_130._8_8_;
      }
      else {
        local_88 = local_140;
      }
      local_78 = (pointer)local_130._0_8_;
      local_80 = local_138;
      local_138 = 0;
      local_130._0_8_ = local_130._0_8_ & 0xffffffffffffff00;
      local_140 = (pointer *)local_130;
      ::std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_140 != (pointer *)local_130) {
        operator_delete(local_140);
      }
      if (local_108 != (pointer *)&local_f8) {
        operator_delete(local_108);
      }
      ::std::__cxx11::string::append((char *)&local_68);
      lVar9 = lVar9 + 1;
    } while (lVar9 != uVar2 + (uVar2 == 0));
  }
  free(local_90);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   anon_var_dwarf_4f000dd + 8,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_110._M_head_impl != (void **)0x0) {
    operator_delete__(local_110._M_head_impl);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return local_98;
}

Assistant:

string StackTrace::ResolveStacktraceSymbols(const string &pointers) {
	auto splits = StringUtil::Split(pointers, ";");
	idx_t frame_count = splits.size();
	auto callstack = unique_ptr<void *[]>(new void *[frame_count]);
	for (idx_t i = 0; i < frame_count; i++) {
		callstack[i] = cast_uint64_to_pointer(StringUtil::ToUnsigned(splits[i]));
	}
	string result;
	char **strs = backtrace_symbols(callstack.get(), NumericCast<int>(frame_count));
	for (idx_t i = 0; i < frame_count; i++) {
		result += CleanupStackTrace(UnmangleSymbol(strs[i]));
		result += "\n";
	}
	free(reinterpret_cast<void *>(strs));
	return "\n" + result;
}